

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
* trial::dynamic::convert::
  overloader<std::set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         *__return_storage_ptr__,basic_variable<std::allocator<char>_> *container,error_code *error)

{
  bool bVar1;
  basic_variable<std::allocator<char>> *this;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__x;
  error_code eVar2;
  undefined4 uStack_c4;
  basic_variable<std::allocator<char>_> *entry;
  undefined1 local_98 [8];
  const_iterator __end0;
  undefined1 local_70 [8];
  const_iterator __begin0;
  basic_variable<std::allocator<char>_> *__range3;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  result;
  error_code *error_local;
  basic_variable<std::allocator<char>_> *container_local;
  
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)error;
  std::
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::set((set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
         *)&__range3);
  __begin0.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = container;
  basic_variable<std::allocator<char>_>::begin((const_iterator *)local_70,container);
  basic_variable<std::allocator<char>_>::end
            ((const_iterator *)local_98,
             (basic_variable<std::allocator<char>_> *)
             __begin0.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_);
  do {
    bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                      ((const_iterator *)local_70,(const_iterator *)local_98);
    if (!bVar1) {
      entry._4_4_ = 2;
LAB_0012e0bb:
      basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
                ((const_iterator *)local_98);
      basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
                ((const_iterator *)local_70);
      if (entry._4_4_ == 2) {
        std::
        set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
        ::set(__return_storage_ptr__,
              (set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               *)&__range3);
      }
      std::
      set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              *)&__range3);
      return __return_storage_ptr__;
    }
    this = (basic_variable<std::allocator<char>> *)
           basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_70);
    bVar1 = basic_variable<std::allocator<char>>::is<std::__cxx11::u32string>(this);
    if (bVar1) {
      __x = basic_variable<std::allocator<char>>::assume_value<std::__cxx11::u32string>(this);
      std::
      set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                *)&__range3,__x);
    }
    else {
      eVar2 = make_error_code(incompatible_type);
      *(ulong *)result._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT44(uStack_c4,eVar2._M_value);
      *(error_category **)(result._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) =
           eVar2._M_cat;
    }
    bVar1 = std::error_code::operator_cast_to_bool
                      ((error_code *)result._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) {
      memset(__return_storage_ptr__,0,0x30);
      std::
      set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::set(__return_storage_ptr__);
      entry._4_4_ = 1;
      goto LAB_0012e0bb;
    }
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_70);
  } while( true );
}

Assistant:

static std::set<T> into(const basic_variable<Allocator>& container,
                            std::error_code& error)
    {
        std::set<T> result;
        for (const auto& entry : container)
        {
            if (entry.template is<T>())
                result.insert(entry.template assume_value<T>());
            else
                error = dynamic::make_error_code(incompatible_type);

            if (error)
                return {};
        }
        return result;
    }